

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

optional<pbrt::CameraRay> * __thiscall
pbrt::OrthographicCamera::GenerateRay
          (optional<pbrt::CameraRay> *__return_storage_ptr__,OrthographicCamera *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  bool bVar1;
  bool bVar2;
  float fVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  undefined1 auVar21 [16];
  Ray local_d0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_struct_8_0_00000001_for___align local_50;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  undefined8 uStack_3c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_30;
  
  auVar21._4_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  auVar21._0_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  auVar21._8_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  auVar21._12_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x;
  auVar18 = vinsertps_avx(*(undefined1 (*) [16])
                           ((this->super_ProjectiveCamera).cameraFromRaster.m.m[0] + 1),
                          ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][1]),
                          0x10);
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y *
                                          (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][1])
                                   ),auVar21,
                            ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][0])
                           );
  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y *
                                         (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][1]))
                           ,auVar21,ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.
                                                  m[2][0]));
  auVar9._0_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y * auVar18._0_4_;
  auVar9._4_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y * auVar18._4_4_;
  auVar9._8_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y * auVar18._8_4_;
  auVar9._12_4_ = sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y * auVar18._12_4_;
  auVar18 = vinsertps_avx((undefined1  [16])(this->super_ProjectiveCamera).cameraFromRaster.m.m[0],
                          ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0]),
                          0x10);
  auVar8 = vfmadd231ss_fma(auVar12,ZEXT816(0) << 0x40,
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][2]))
  ;
  auVar12 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar7 = vfmadd231ss_fma(auVar7,ZEXT816(0) << 0x40,
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2]))
  ;
  fVar10 = auVar8._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][3];
  fVar11 = auVar7._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][3];
  auVar7 = vfmadd213ps_fma(auVar18,auVar21,auVar9);
  auVar18 = vinsertps_avx(*(undefined1 (*) [16])
                           ((this->super_ProjectiveCamera).cameraFromRaster.m.m[0] + 2),
                          ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2]),
                          0x10);
  bVar2 = fVar10 == 1.0;
  auVar7 = vfmadd213ps_fma(auVar18,ZEXT816(0) << 0x20,auVar7);
  auVar18 = vinsertps_avx(*(undefined1 (*) [16])
                           ((this->super_ProjectiveCamera).cameraFromRaster.m.m[0] + 3),
                          ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][3]),
                          0x10);
  uVar5 = 0xff;
  if (!bVar2) {
    uVar5 = 0;
  }
  uVar6 = (ulong)uVar5;
  if (NAN(fVar10)) {
    uVar6 = 0;
  }
  local_d0.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_ProjectiveCamera).super_CameraBase.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar8._0_4_ = auVar18._0_4_ + auVar7._0_4_;
  auVar8._4_4_ = auVar18._4_4_ + auVar7._4_4_;
  auVar8._8_4_ = auVar18._8_4_ + auVar7._8_4_;
  auVar8._12_4_ = auVar18._12_4_ + auVar7._12_4_;
  auVar18._4_4_ = fVar10;
  auVar18._0_4_ = fVar10;
  auVar18._8_4_ = fVar10;
  auVar18._12_4_ = fVar10;
  auVar18 = vdivps_avx(auVar8,auVar18);
  bVar1 = (bool)((byte)uVar6 & 1);
  auVar7._0_4_ = (uint)bVar1 * (int)auVar8._0_4_ | (uint)!bVar1 * auVar18._0_4_;
  bVar1 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar7._4_4_ = (uint)bVar1 * (int)auVar8._4_4_ | (uint)!bVar1 * auVar18._4_4_;
  bVar1 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar7._8_4_ = (uint)bVar1 * (int)auVar8._8_4_ | (uint)!bVar1 * auVar18._8_4_;
  bVar1 = (bool)((byte)(uVar6 >> 3) & 1);
  auVar7._12_4_ = (uint)bVar1 * (int)auVar8._12_4_ | (uint)!bVar1 * auVar18._12_4_;
  local_d0.o.super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar2 * (int)fVar11 + (uint)!bVar2 * (int)(fVar11 / fVar10));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(sample.time *
                                          (this->super_ProjectiveCamera).super_CameraBase.
                                          shutterClose)),ZEXT416((uint)(1.0 - sample.time)),
                            ZEXT416((uint)(this->super_ProjectiveCamera).super_CameraBase.
                                          shutterOpen));
  local_d0.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar7);
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  local_d0.time = auVar18._0_4_;
  fVar10 = (this->super_ProjectiveCamera).lensRadius;
  if (0.0 < fVar10) {
    auVar15._0_4_ =
         sample.pLens.super_Tuple2<pbrt::Point2,_float>.x +
         sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
    auVar15._4_4_ =
         sample.pLens.super_Tuple2<pbrt::Point2,_float>.y +
         sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
    auVar15._8_8_ = 0;
    auVar4._8_4_ = 0xbf800000;
    auVar4._0_8_ = 0xbf800000bf800000;
    auVar4._12_4_ = 0xbf800000;
    auVar8 = vaddps_avx512vl(auVar15,auVar4);
    fVar11 = auVar8._0_4_;
    auVar18 = vmovshdup_avx(auVar8);
    fVar20 = auVar18._0_4_;
    if (((fVar11 != 0.0) || (fVar20 != 0.0)) ||
       (fVar3 = local_d0.o.super_Tuple3<pbrt::Point3,_float>.z, NAN(fVar20))) {
      auVar12._8_4_ = 0x7fffffff;
      auVar12._0_8_ = 0x7fffffff7fffffff;
      auVar12._12_4_ = 0x7fffffff;
      auVar9 = vandps_avx512vl(auVar8,auVar12);
      local_88 = ZEXT416((uint)fVar10);
      auVar12 = vshufps_avx(auVar9,auVar9,0xf5);
      auVar13._0_4_ = fVar11 / fVar20;
      auVar13._4_12_ = auVar8._4_12_;
      bVar2 = auVar12._0_4_ < auVar9._0_4_;
      auVar12 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar13,ZEXT416(0x3fc90fdb));
      local_a8._4_12_ = auVar12._4_12_;
      local_a8._0_4_ =
           (uint)bVar2 * (int)((fVar20 / fVar11) * 0.7853982) + (uint)!bVar2 * auVar12._0_4_;
      local_98._4_12_ = auVar18._4_12_;
      local_98._0_4_ = (uint)bVar2 * (int)fVar11 + (uint)!bVar2 * (int)fVar20;
      local_78 = auVar7;
      local_68 = ZEXT416((uint)local_d0.o.super_Tuple3<pbrt::Point3,_float>.z);
      fVar10 = cosf((float)local_a8._0_4_);
      fVar11 = sinf((float)local_a8._0_4_);
      auVar12 = vinsertps_avx(ZEXT416((uint)((float)local_98._0_4_ * fVar10)),
                              ZEXT416((uint)((float)local_98._0_4_ * fVar11)),0x10);
      auVar7 = local_78;
      fVar3 = (float)local_68._0_4_;
      fVar10 = (float)local_88._0_4_;
    }
    fVar11 = (this->super_ProjectiveCamera).focalDistance;
    auVar14._0_4_ = fVar10 * auVar12._0_4_;
    auVar14._4_4_ = fVar10 * auVar12._4_4_;
    auVar14._8_4_ = fVar10 * auVar12._8_4_;
    auVar14._12_4_ = fVar10 * auVar12._12_4_;
    local_d0.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar14);
    local_d0.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
    fVar10 = fVar11 * 0.0;
    fVar3 = fVar3 + fVar11;
    auVar16._0_4_ = fVar10 + auVar7._0_4_;
    auVar16._4_4_ = fVar10 + auVar7._4_4_;
    auVar16._8_4_ = fVar10 + auVar7._8_4_;
    auVar16._12_4_ = fVar10 + auVar7._12_4_;
    auVar12 = vsubps_avx(auVar16,auVar14);
    auVar17._0_4_ = auVar12._0_4_ * auVar12._0_4_;
    auVar17._4_4_ = auVar12._4_4_ * auVar12._4_4_;
    auVar17._8_4_ = auVar12._8_4_ * auVar12._8_4_;
    auVar17._12_4_ = auVar12._12_4_ * auVar12._12_4_;
    auVar18 = vmovshdup_avx(auVar17);
    auVar18 = vfmadd231ss_fma(auVar18,auVar12,auVar12);
    auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
    auVar18 = vsqrtss_avx(auVar18,auVar18);
    local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar18._0_4_;
    auVar19._4_4_ = local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar19._0_4_ = local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar19._8_4_ = local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar19._12_4_ = local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z;
    local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z =
         fVar3 / local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar18 = vdivps_avx(auVar12,auVar19);
    local_d0.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar18);
  }
  AnimatedTransform::operator()((Ray *)&local_50,(AnimatedTransform *)this,&local_d0,(Float *)0x0);
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align = local_50;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) = CONCAT44(fStack_44,fStack_48);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) = CONCAT44(fStack_40,fStack_44);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = uStack_3c;
  ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    *)((long)&__return_storage_ptr__->optionalValue + 0x20))->bits = local_30.bits;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0x3f8000003f800000;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0x3f8000003f800000;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRay> OrthographicCamera::GenerateRay(
    CameraSample sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);

    Ray ray(pCamera, Vector3f(0, 0, 1), SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    return CameraRay{RenderFromCamera(ray)};
}